

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O0

void __thiscall
doctest::detail::ResultBuilder::binary_assert<0,supermap::Key<4ul>,supermap::Key<4ul>>
          (ResultBuilder *this,Key<4UL> *lhs,Key<4UL> *rhs)

{
  bool bVar1;
  ContextOptions *pCVar2;
  RelationalComparator<0,_supermap::Key<4UL>,_supermap::Key<4UL>_> *in_RDI;
  Key<4UL> *in_stack_00000028;
  char *in_stack_00000030;
  Key<4UL> *in_stack_00000038;
  Key<4UL> *in_stack_ffffffffffffffa8;
  String *in_stack_ffffffffffffffb8;
  String *in_stack_ffffffffffffffc0;
  
  bVar1 = RelationalComparator<0,_supermap::Key<4UL>,_supermap::Key<4UL>_>::operator()
                    (in_RDI,in_stack_ffffffffffffffa8,(Key<4UL> *)0x1fc121);
  in_RDI[0x28] = (RelationalComparator<0,_supermap::Key<4UL>,_supermap::Key<4UL>_>)
                 ((bVar1 ^ 0xffU) & 1);
  if ((((byte)in_RDI[0x28] & 1) == 0) && (pCVar2 = getContextOptions(), (pCVar2->success & 1U) == 0)
     ) {
    return;
  }
  stringifyBinaryExpr<supermap::Key<4ul>,supermap::Key<4ul>>
            (in_stack_00000038,in_stack_00000030,in_stack_00000028);
  String::operator=(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  String::~String(in_stack_ffffffffffffffc0);
  return;
}

Assistant:

DOCTEST_NOINLINE void binary_assert(const DOCTEST_REF_WRAP(L) lhs,
                                            const DOCTEST_REF_WRAP(R) rhs) {
            m_failed = !RelationalComparator<comparison, L, R>()(lhs, rhs);
            if(m_failed || getContextOptions()->success)
                m_decomp = stringifyBinaryExpr(lhs, ", ", rhs);
        }